

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_cry_Rsa.h
# Opt level: O2

bool __thiscall
axl::cry::Rsa::verifyHash
          (Rsa *this,int type,void *hash,size_t hashSize,void *signature,size_t signatureSize)

{
  int iVar1;
  
  iVar1 = RSA_verify(type,(uchar *)hash,(uint)hashSize,(uchar *)signature,(uint)signatureSize,
                     (RSA *)(this->
                            super_Handle<rsa_st_*,_axl::cry::FreeRsa,_axl::sl::Zero<rsa_st_*>_>).m_h
                    );
  return iVar1 == 1;
}

Assistant:

bool
	verifyHash(
		int type,
		const void* hash,
		size_t hashSize,
		const void* signature,
		size_t signatureSize
	) {
		return RSA_verify(
			type,
			(const uchar_t*)hash,
			(int)hashSize,
			(const uchar_t*)signature,
			(int)signatureSize,
			m_h
		) == 1;
	}